

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

FuncInfo * __thiscall ByteCodeGenerator::FindEnclosingNonLambda(ByteCodeGenerator *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  FuncInfo *pFVar4;
  undefined4 *puVar5;
  Scope *local_20;
  Scope *scope;
  ByteCodeGenerator *this_local;
  
  local_20 = GetCurrentScope(this);
  while( true ) {
    if (local_20 == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x731,"(0)","0");
      if (bVar2) {
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
        return (FuncInfo *)0x0;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pFVar4 = Scope::GetFunc(local_20);
    BVar3 = FuncInfo::IsLambda(pFVar4);
    if (BVar3 == 0) break;
    local_20 = Scope::GetEnclosingScope(local_20);
  }
  pFVar4 = Scope::GetFunc(local_20);
  return pFVar4;
}

Assistant:

FuncInfo *ByteCodeGenerator::FindEnclosingNonLambda()
{
    for (Scope *scope = GetCurrentScope(); scope; scope = scope->GetEnclosingScope())
    {
        if (!scope->GetFunc()->IsLambda())
        {
            return scope->GetFunc();
        }
    }
    Assert(0);
    return nullptr;
}